

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  byte bVar27;
  byte bVar28;
  int iVar29;
  float *vertices;
  undefined1 (*pauVar30) [32];
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  byte bVar34;
  byte bVar35;
  undefined4 uVar36;
  NodeRef root;
  ulong uVar37;
  ulong *puVar38;
  bool bVar39;
  ulong uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar76 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar77 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  Precalculations pre;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d01;
  size_t local_5d00;
  ulong local_5cf8;
  RayK<8> *local_5cf0;
  RayQueryContext *local_5ce8;
  undefined4 local_5cdc;
  RayK<8> *local_5cd8;
  BVH *local_5cd0;
  Intersectors *local_5cc8;
  ulong local_5cc0;
  ulong local_5cb8;
  Scene *local_5cb0;
  long local_5ca8;
  undefined1 local_5ca0 [32];
  RTCFilterFunctionNArguments local_5c70;
  undefined1 local_5c40 [32];
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 local_5c10;
  undefined8 uStack_5c08;
  undefined1 local_5c00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5be0;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined1 local_5ae0 [32];
  int local_5ac0;
  int iStack_5abc;
  int iStack_5ab8;
  int iStack_5ab4;
  int iStack_5ab0;
  int iStack_5aac;
  int iStack_5aa8;
  int iStack_5aa4;
  uint local_5aa0;
  uint uStack_5a9c;
  uint uStack_5a98;
  uint uStack_5a94;
  uint uStack_5a90;
  uint uStack_5a8c;
  uint uStack_5a88;
  uint uStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [8];
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined1 local_5960 [8];
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5cd0 = (BVH *)This->ptr;
  local_5808 = (local_5cd0->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar41 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar68 = ZEXT816(0) << 0x40;
      uVar40 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar68),5);
      uVar31 = vpcmpeqd_avx512vl(auVar41,(undefined1  [32])valid_i->field_0);
      uVar40 = uVar40 & uVar31;
      bVar34 = (byte)uVar40;
      if (bVar34 != 0) {
        local_5be0._0_8_ = *(undefined8 *)ray;
        local_5be0._8_8_ = *(undefined8 *)(ray + 8);
        local_5be0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5be0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5be0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5be0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5be0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5be0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5be0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5be0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5be0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5be0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5b80 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b60 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5b40 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar79 = ZEXT3264(auVar41);
        vandps_avx512vl(local_5b80,auVar41);
        auVar65._8_4_ = 0x219392ef;
        auVar65._0_8_ = 0x219392ef219392ef;
        auVar65._12_4_ = 0x219392ef;
        auVar65._16_4_ = 0x219392ef;
        auVar65._20_4_ = 0x219392ef;
        auVar65._24_4_ = 0x219392ef;
        auVar65._28_4_ = 0x219392ef;
        auVar76 = ZEXT3264(auVar65);
        uVar31 = vcmpps_avx512vl(auVar41,auVar65,1);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar80 = ZEXT3264(auVar42);
        auVar43 = vdivps_avx512vl(auVar42,local_5b80);
        vandps_avx512vl(local_5b60,auVar41);
        uVar37 = vcmpps_avx512vl(auVar43,auVar65,1);
        auVar44 = vdivps_avx512vl(auVar42,local_5b60);
        vandps_avx512vl(local_5b40,auVar41);
        uVar32 = vcmpps_avx512vl(auVar44,auVar65,1);
        auVar41 = vdivps_avx512vl(auVar42,local_5b40);
        bVar39 = (bool)((byte)uVar31 & 1);
        local_5b20._0_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._0_4_;
        bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
        local_5b20._4_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._4_4_;
        bVar39 = (bool)((byte)(uVar31 >> 2) & 1);
        fStack_5b18 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._8_4_);
        bVar39 = (bool)((byte)(uVar31 >> 3) & 1);
        fStack_5b14 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._12_4_);
        bVar39 = (bool)((byte)(uVar31 >> 4) & 1);
        fStack_5b10 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._16_4_);
        bVar39 = (bool)((byte)(uVar31 >> 5) & 1);
        fStack_5b0c = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._20_4_);
        bVar39 = (bool)((byte)(uVar31 >> 6) & 1);
        fStack_5b08 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._24_4_);
        bVar39 = SUB81(uVar31 >> 7,0);
        register0x00000918 = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar43._28_4_;
        bVar39 = (bool)((byte)uVar37 & 1);
        local_5b00._0_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._0_4_;
        bVar39 = (bool)((byte)(uVar37 >> 1) & 1);
        local_5b00._4_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._4_4_;
        bVar39 = (bool)((byte)(uVar37 >> 2) & 1);
        fStack_5af8 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._8_4_);
        bVar39 = (bool)((byte)(uVar37 >> 3) & 1);
        fStack_5af4 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._12_4_);
        bVar39 = (bool)((byte)(uVar37 >> 4) & 1);
        fStack_5af0 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._16_4_);
        bVar39 = (bool)((byte)(uVar37 >> 5) & 1);
        fStack_5aec = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._20_4_);
        bVar39 = (bool)((byte)(uVar37 >> 6) & 1);
        fStack_5ae8 = (float)((uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._24_4_);
        bVar39 = SUB81(uVar37 >> 7,0);
        register0x00000918 = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar44._28_4_;
        bVar39 = (bool)((byte)uVar32 & 1);
        local_5ae0._0_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._0_4_;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        local_5ae0._4_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._4_4_;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        local_5ae0._8_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._8_4_;
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        local_5ae0._12_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._12_4_;
        bVar39 = (bool)((byte)(uVar32 >> 4) & 1);
        local_5ae0._16_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._16_4_;
        bVar39 = (bool)((byte)(uVar32 >> 5) & 1);
        local_5ae0._20_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._20_4_;
        bVar39 = (bool)((byte)(uVar32 >> 6) & 1);
        local_5ae0._24_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._24_4_;
        bVar39 = SUB81(uVar32 >> 7,0);
        local_5ae0._28_4_ = (uint)bVar39 * 0x5d5e0b6b | (uint)!bVar39 * auVar41._28_4_;
        uVar31 = vcmpps_avx512vl(_local_5b20,ZEXT1632(auVar68),1);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5ac0 = (uint)((byte)uVar31 & 1) * auVar41._0_4_;
        iStack_5abc = (uint)((byte)(uVar31 >> 1) & 1) * auVar41._4_4_;
        iStack_5ab8 = (uint)((byte)(uVar31 >> 2) & 1) * auVar41._8_4_;
        iStack_5ab4 = (uint)((byte)(uVar31 >> 3) & 1) * auVar41._12_4_;
        iStack_5ab0 = (uint)((byte)(uVar31 >> 4) & 1) * auVar41._16_4_;
        iStack_5aac = (uint)((byte)(uVar31 >> 5) & 1) * auVar41._20_4_;
        iStack_5aa8 = (uint)((byte)(uVar31 >> 6) & 1) * auVar41._24_4_;
        iStack_5aa4 = (uint)(byte)(uVar31 >> 7) * auVar41._28_4_;
        auVar42 = ZEXT1632(auVar68);
        uVar31 = vcmpps_avx512vl(_local_5b00,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar39 = (bool)((byte)uVar31 & 1);
        bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar31 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar31 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar31 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar31 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar31 >> 6) & 1);
        bVar12 = SUB81(uVar31 >> 7,0);
        local_5aa0 = (uint)bVar39 * auVar41._0_4_ | (uint)!bVar39 * 0x60;
        uStack_5a9c = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0x60;
        uStack_5a98 = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * 0x60;
        uStack_5a94 = (uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * 0x60;
        uStack_5a90 = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * 0x60;
        uStack_5a8c = (uint)bVar10 * auVar41._20_4_ | (uint)!bVar10 * 0x60;
        uStack_5a88 = (uint)bVar11 * auVar41._24_4_ | (uint)!bVar11 * 0x60;
        uStack_5a84 = (uint)bVar12 * auVar41._28_4_ | (uint)!bVar12 * 0x60;
        uVar31 = vcmpps_avx512vl(local_5ae0,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar39 = (bool)((byte)uVar31 & 1);
        bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar31 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar31 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar31 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar31 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar31 >> 6) & 1);
        bVar12 = SUB81(uVar31 >> 7,0);
        local_5a80 = (uint)bVar39 * auVar41._0_4_ | (uint)!bVar39 * 0xa0;
        uStack_5a7c = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0xa0;
        uStack_5a78 = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * 0xa0;
        uStack_5a74 = (uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * 0xa0;
        uStack_5a70 = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * 0xa0;
        uStack_5a6c = (uint)bVar10 * auVar41._20_4_ | (uint)!bVar10 * 0xa0;
        uStack_5a68 = (uint)bVar11 * auVar41._24_4_ | (uint)!bVar11 * 0xa0;
        uStack_5a64 = (uint)bVar12 * auVar41._28_4_ | (uint)!bVar12 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar81 = ZEXT3264(local_4680);
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar42);
        local_5a60._0_4_ =
             (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * local_4680._0_4_;
        bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
        local_5a60._4_4_ = (uint)bVar39 * auVar41._4_4_ | (uint)!bVar39 * local_4680._4_4_;
        bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
        local_5a60._8_4_ = (uint)bVar39 * auVar41._8_4_ | (uint)!bVar39 * local_4680._8_4_;
        bVar39 = (bool)((byte)(uVar40 >> 3) & 1);
        local_5a60._12_4_ = (uint)bVar39 * auVar41._12_4_ | (uint)!bVar39 * local_4680._12_4_;
        bVar39 = (bool)((byte)(uVar40 >> 4) & 1);
        local_5a60._16_4_ = (uint)bVar39 * auVar41._16_4_ | (uint)!bVar39 * local_4680._16_4_;
        bVar39 = (bool)((byte)(uVar40 >> 5) & 1);
        local_5a60._20_4_ = (uint)bVar39 * auVar41._20_4_ | (uint)!bVar39 * local_4680._20_4_;
        bVar39 = (bool)((byte)(uVar40 >> 6) & 1);
        local_5a60._24_4_ = (uint)bVar39 * auVar41._24_4_ | (uint)!bVar39 * local_4680._24_4_;
        bVar39 = SUB81(uVar40 >> 7,0);
        local_5a60._28_4_ = (uint)bVar39 * auVar41._28_4_ | (uint)!bVar39 * local_4680._28_4_;
        local_5cdc = (undefined4)uVar40;
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar42);
        local_5a40._0_4_ =
             (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
        local_5a40._4_4_ = (uint)bVar39 * auVar41._4_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
        local_5a40._8_4_ = (uint)bVar39 * auVar41._8_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 3) & 1);
        local_5a40._12_4_ = (uint)bVar39 * auVar41._12_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 4) & 1);
        local_5a40._16_4_ = (uint)bVar39 * auVar41._16_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 5) & 1);
        local_5a40._20_4_ = (uint)bVar39 * auVar41._20_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = (bool)((byte)(uVar40 >> 6) & 1);
        local_5a40._24_4_ = (uint)bVar39 * auVar41._24_4_ | (uint)!bVar39 * -0x800000;
        bVar39 = SUB81(uVar40 >> 7,0);
        local_5a40._28_4_ = (uint)bVar39 * auVar41._28_4_ | (uint)!bVar39 * -0x800000;
        bVar34 = ~bVar34;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar40 = 7;
        }
        else {
          uVar40 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5cd8 = ray + 0x100;
        puVar38 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar30 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5a60;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar82 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar83 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar84 = ZEXT3264(auVar41);
        local_5cf8 = uVar40;
        local_5cf0 = ray;
        local_5ce8 = context;
        local_5cc8 = This;
LAB_01f58ac3:
        do {
          do {
            root.ptr = puVar38[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01f59578;
            puVar38 = puVar38 + -1;
            pauVar30 = pauVar30 + -1;
            auVar41 = *pauVar30;
            auVar75 = ZEXT3264(auVar41);
            uVar31 = vcmpps_avx512vl(auVar41,local_5a40,1);
          } while ((char)uVar31 == '\0');
          uVar36 = (undefined4)uVar31;
          if (uVar40 < (uint)POPCOUNT(uVar36)) {
LAB_01f58b05:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01f59578;
                uVar19 = vcmpps_avx512vl(auVar75._0_32_,local_5a40,9);
                if ((char)uVar19 == '\0') goto LAB_01f58ac3;
                local_5cc0 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar27 = bVar34;
                if (local_5cc0 == 0) goto LAB_01f59441;
                bVar27 = ~bVar34;
                lVar33 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                uVar31 = 0;
                goto LAB_01f58cf0;
              }
              uVar31 = 8;
              lVar33 = 0;
              auVar41 = auVar81._0_32_;
              do {
                uVar37 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar33 * 8);
                if (uVar37 == 8) {
                  auVar75 = ZEXT3264(auVar41);
                  break;
                }
                uVar36 = *(undefined4 *)(root.ptr + 0x40 + lVar33 * 4);
                auVar69._4_4_ = uVar36;
                auVar69._0_4_ = uVar36;
                auVar69._8_4_ = uVar36;
                auVar69._12_4_ = uVar36;
                auVar69._16_4_ = uVar36;
                auVar69._20_4_ = uVar36;
                auVar69._24_4_ = uVar36;
                auVar69._28_4_ = uVar36;
                auVar24._8_8_ = local_5be0._8_8_;
                auVar24._0_8_ = local_5be0._0_8_;
                auVar24._16_8_ = local_5be0._16_8_;
                auVar24._24_8_ = local_5be0._24_8_;
                auVar25._8_8_ = local_5be0._40_8_;
                auVar25._0_8_ = local_5be0._32_8_;
                auVar25._16_8_ = local_5be0._48_8_;
                auVar25._24_8_ = local_5be0._56_8_;
                auVar26._8_8_ = local_5be0._72_8_;
                auVar26._0_8_ = local_5be0._64_8_;
                auVar26._16_8_ = local_5be0._80_8_;
                auVar26._24_8_ = local_5be0._88_8_;
                auVar42 = vsubps_avx(auVar69,auVar24);
                auVar75._0_4_ = (float)local_5b20._0_4_ * auVar42._0_4_;
                auVar75._4_4_ = (float)local_5b20._4_4_ * auVar42._4_4_;
                auVar75._8_4_ = fStack_5b18 * auVar42._8_4_;
                auVar75._12_4_ = fStack_5b14 * auVar42._12_4_;
                auVar75._16_4_ = fStack_5b10 * auVar42._16_4_;
                auVar75._20_4_ = fStack_5b0c * auVar42._20_4_;
                auVar75._28_36_ = auVar76._28_36_;
                auVar75._24_4_ = fStack_5b08 * auVar42._24_4_;
                auVar65 = auVar75._0_32_;
                auVar76 = ZEXT3264(auVar65);
                uVar36 = *(undefined4 *)(root.ptr + 0x80 + lVar33 * 4);
                auVar70._4_4_ = uVar36;
                auVar70._0_4_ = uVar36;
                auVar70._8_4_ = uVar36;
                auVar70._12_4_ = uVar36;
                auVar70._16_4_ = uVar36;
                auVar70._20_4_ = uVar36;
                auVar70._24_4_ = uVar36;
                auVar70._28_4_ = uVar36;
                auVar42 = vsubps_avx(auVar70,auVar25);
                auVar77._0_4_ = (float)local_5b00._0_4_ * auVar42._0_4_;
                auVar77._4_4_ = (float)local_5b00._4_4_ * auVar42._4_4_;
                auVar77._8_4_ = fStack_5af8 * auVar42._8_4_;
                auVar77._12_4_ = fStack_5af4 * auVar42._12_4_;
                auVar77._16_4_ = fStack_5af0 * auVar42._16_4_;
                auVar77._20_4_ = fStack_5aec * auVar42._20_4_;
                auVar77._28_36_ = in_ZMM8._28_36_;
                auVar77._24_4_ = fStack_5ae8 * auVar42._24_4_;
                auVar67 = auVar77._0_32_;
                in_ZMM8 = ZEXT3264(auVar67);
                uVar36 = *(undefined4 *)(root.ptr + 0xc0 + lVar33 * 4);
                auVar71._4_4_ = uVar36;
                auVar71._0_4_ = uVar36;
                auVar71._8_4_ = uVar36;
                auVar71._12_4_ = uVar36;
                auVar71._16_4_ = uVar36;
                auVar71._20_4_ = uVar36;
                auVar71._24_4_ = uVar36;
                auVar71._28_4_ = uVar36;
                auVar42 = vsubps_avx(auVar71,auVar26);
                auVar78._0_4_ = local_5ae0._0_4_ * auVar42._0_4_;
                auVar78._4_4_ = local_5ae0._4_4_ * auVar42._4_4_;
                auVar78._8_4_ = local_5ae0._8_4_ * auVar42._8_4_;
                auVar78._12_4_ = local_5ae0._12_4_ * auVar42._12_4_;
                auVar78._16_4_ = local_5ae0._16_4_ * auVar42._16_4_;
                auVar78._20_4_ = local_5ae0._20_4_ * auVar42._20_4_;
                auVar78._28_36_ = in_ZMM10._28_36_;
                auVar78._24_4_ = local_5ae0._24_4_ * auVar42._24_4_;
                auVar66 = auVar78._0_32_;
                in_ZMM10 = ZEXT3264(auVar66);
                uVar36 = *(undefined4 *)(root.ptr + 0x60 + lVar33 * 4);
                auVar72._4_4_ = uVar36;
                auVar72._0_4_ = uVar36;
                auVar72._8_4_ = uVar36;
                auVar72._12_4_ = uVar36;
                auVar72._16_4_ = uVar36;
                auVar72._20_4_ = uVar36;
                auVar72._24_4_ = uVar36;
                auVar72._28_4_ = uVar36;
                auVar42 = vsubps_avx(auVar72,auVar24);
                auVar62._4_4_ = (float)local_5b20._4_4_ * auVar42._4_4_;
                auVar62._0_4_ = (float)local_5b20._0_4_ * auVar42._0_4_;
                auVar62._8_4_ = fStack_5b18 * auVar42._8_4_;
                auVar62._12_4_ = fStack_5b14 * auVar42._12_4_;
                auVar62._16_4_ = fStack_5b10 * auVar42._16_4_;
                auVar62._20_4_ = fStack_5b0c * auVar42._20_4_;
                auVar62._24_4_ = fStack_5b08 * auVar42._24_4_;
                auVar62._28_4_ = (int)((ulong)local_5be0._24_8_ >> 0x20);
                uVar36 = *(undefined4 *)(root.ptr + 0xa0 + lVar33 * 4);
                auVar73._4_4_ = uVar36;
                auVar73._0_4_ = uVar36;
                auVar73._8_4_ = uVar36;
                auVar73._12_4_ = uVar36;
                auVar73._16_4_ = uVar36;
                auVar73._20_4_ = uVar36;
                auVar73._24_4_ = uVar36;
                auVar73._28_4_ = uVar36;
                auVar42 = vsubps_avx(auVar73,auVar25);
                auVar63._4_4_ = (float)local_5b00._4_4_ * auVar42._4_4_;
                auVar63._0_4_ = (float)local_5b00._0_4_ * auVar42._0_4_;
                auVar63._8_4_ = fStack_5af8 * auVar42._8_4_;
                auVar63._12_4_ = fStack_5af4 * auVar42._12_4_;
                auVar63._16_4_ = fStack_5af0 * auVar42._16_4_;
                auVar63._20_4_ = fStack_5aec * auVar42._20_4_;
                auVar63._24_4_ = fStack_5ae8 * auVar42._24_4_;
                auVar63._28_4_ = (int)((ulong)local_5be0._56_8_ >> 0x20);
                uVar36 = *(undefined4 *)(root.ptr + 0xe0 + lVar33 * 4);
                auVar74._4_4_ = uVar36;
                auVar74._0_4_ = uVar36;
                auVar74._8_4_ = uVar36;
                auVar74._12_4_ = uVar36;
                auVar74._16_4_ = uVar36;
                auVar74._20_4_ = uVar36;
                auVar74._24_4_ = uVar36;
                auVar74._28_4_ = uVar36;
                auVar42 = vsubps_avx(auVar74,auVar26);
                auVar64._4_4_ = local_5ae0._4_4_ * auVar42._4_4_;
                auVar64._0_4_ = local_5ae0._0_4_ * auVar42._0_4_;
                auVar64._8_4_ = local_5ae0._8_4_ * auVar42._8_4_;
                auVar64._12_4_ = local_5ae0._12_4_ * auVar42._12_4_;
                auVar64._16_4_ = local_5ae0._16_4_ * auVar42._16_4_;
                auVar64._20_4_ = local_5ae0._20_4_ * auVar42._20_4_;
                auVar64._24_4_ = local_5ae0._24_4_ * auVar42._24_4_;
                auVar64._28_4_ = (int)((ulong)local_5be0._88_8_ >> 0x20);
                auVar42 = vminps_avx(auVar65,auVar62);
                auVar43 = vminps_avx(auVar67,auVar63);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar43 = vminps_avx(auVar66,auVar64);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar44 = vmulps_avx512vl(auVar42,auVar82._0_32_);
                auVar42 = vmaxps_avx(auVar65,auVar62);
                auVar43 = vmaxps_avx(auVar67,auVar63);
                auVar43 = vminps_avx(auVar42,auVar43);
                auVar42 = vmaxps_avx(auVar66,auVar64);
                auVar42 = vminps_avx(auVar43,auVar42);
                auVar43 = vmulps_avx512vl(auVar42,auVar83._0_32_);
                auVar42 = vmaxps_avx(auVar44,local_5a60);
                auVar43 = vminps_avx(auVar43,local_5a40);
                uVar32 = vcmpps_avx512vl(auVar42,auVar43,2);
                if ((byte)uVar32 == 0) {
                  auVar75 = ZEXT3264(auVar41);
                  uVar37 = uVar31;
                }
                else {
                  auVar42 = vblendmps_avx512vl(auVar81._0_32_,auVar44);
                  bVar39 = (bool)((byte)uVar32 & 1);
                  bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
                  bVar8 = (bool)((byte)(uVar32 >> 3) & 1);
                  bVar9 = (bool)((byte)(uVar32 >> 4) & 1);
                  bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
                  bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
                  bVar12 = SUB81(uVar32 >> 7,0);
                  auVar75 = ZEXT3264(CONCAT428((uint)bVar12 * auVar42._28_4_ |
                                               (uint)!bVar12 * auVar44._28_4_,
                                               CONCAT424((uint)bVar11 * auVar42._24_4_ |
                                                         (uint)!bVar11 * auVar44._24_4_,
                                                         CONCAT420((uint)bVar10 * auVar42._20_4_ |
                                                                   (uint)!bVar10 * auVar44._20_4_,
                                                                   CONCAT416((uint)bVar9 *
                                                                             auVar42._16_4_ |
                                                                             (uint)!bVar9 *
                                                                             auVar44._16_4_,
                                                                             CONCAT412((uint)bVar8 *
                                                                                       auVar42.
                                                  _12_4_ | (uint)!bVar8 * auVar44._12_4_,
                                                  CONCAT48((uint)bVar7 * auVar42._8_4_ |
                                                           (uint)!bVar7 * auVar44._8_4_,
                                                           CONCAT44((uint)bVar6 * auVar42._4_4_ |
                                                                    (uint)!bVar6 * auVar44._4_4_,
                                                                    (uint)bVar39 * auVar42._0_4_ |
                                                                    (uint)!bVar39 * auVar44._0_4_)))
                                                  )))));
                  if (uVar31 != 8) {
                    *puVar38 = uVar31;
                    puVar38 = puVar38 + 1;
                    *pauVar30 = auVar41;
                    pauVar30 = pauVar30 + 1;
                  }
                }
                uVar31 = uVar37;
                lVar33 = lVar33 + 1;
                auVar41 = auVar75._0_32_;
              } while (lVar33 != 8);
              iVar29 = 4;
              if (uVar31 == 8) goto LAB_01f58c98;
              uVar19 = vcmpps_avx512vl(auVar75._0_32_,local_5a40,9);
              root.ptr = uVar31;
            } while ((byte)uVar40 < (byte)POPCOUNT((int)uVar19));
            *puVar38 = uVar31;
            puVar38 = puVar38 + 1;
            *pauVar30 = auVar75._0_32_;
            pauVar30 = pauVar30 + 1;
          }
          else {
            do {
              local_5ca0 = auVar41;
              local_5d00 = 0;
              for (uVar40 = uVar31; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                local_5d00 = local_5d00 + 1;
              }
              auVar76 = ZEXT1664(auVar76._0_16_);
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
              bVar39 = occluded1(local_5cc8,local_5cd0,root,local_5d00,&local_5d01,local_5cf0,
                                 (TravRayK<8,_true> *)&local_5be0.field_0,context);
              bVar27 = (byte)(1 << ((uint)local_5d00 & 0x1f));
              if (!bVar39) {
                bVar27 = 0;
              }
              bVar34 = bVar34 | bVar27;
              uVar31 = uVar31 - 1 & uVar31;
              context = local_5ce8;
              auVar41 = local_5ca0;
            } while (uVar31 != 0);
            if (bVar34 == 0xff) {
              iVar29 = 3;
            }
            else {
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5a40._0_4_ =
                   (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * local_5a40._0_4_
              ;
              bVar39 = (bool)(bVar34 >> 1 & 1);
              local_5a40._4_4_ = (uint)bVar39 * auVar41._4_4_ | (uint)!bVar39 * local_5a40._4_4_;
              bVar39 = (bool)(bVar34 >> 2 & 1);
              local_5a40._8_4_ = (uint)bVar39 * auVar41._8_4_ | (uint)!bVar39 * local_5a40._8_4_;
              bVar39 = (bool)(bVar34 >> 3 & 1);
              local_5a40._12_4_ = (uint)bVar39 * auVar41._12_4_ | (uint)!bVar39 * local_5a40._12_4_;
              bVar39 = (bool)(bVar34 >> 4 & 1);
              local_5a40._16_4_ = (uint)bVar39 * auVar41._16_4_ | (uint)!bVar39 * local_5a40._16_4_;
              bVar39 = (bool)(bVar34 >> 5 & 1);
              local_5a40._20_4_ = (uint)bVar39 * auVar41._20_4_ | (uint)!bVar39 * local_5a40._20_4_;
              bVar39 = (bool)(bVar34 >> 6 & 1);
              local_5a40._24_4_ = (uint)bVar39 * auVar41._24_4_ | (uint)!bVar39 * local_5a40._24_4_;
              local_5a40._28_4_ =
                   (uint)(bVar34 >> 7) * auVar41._28_4_ |
                   (uint)!(bool)(bVar34 >> 7) * local_5a40._28_4_;
              iVar29 = 2;
            }
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar81 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar82 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar83 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar79 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar80 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar84 = ZEXT3264(auVar41);
            auVar75 = ZEXT3264(local_5ca0);
            ray = local_5cf0;
            uVar40 = local_5cf8;
            if ((uint)local_5cf8 < (uint)POPCOUNT(uVar36)) goto LAB_01f58b05;
          }
LAB_01f58c98:
        } while ((iVar29 == 4) || (iVar29 == 2));
LAB_01f59578:
        bVar34 = bVar34 & (byte)local_5cdc;
        bVar39 = (bool)(bVar34 >> 1 & 1);
        bVar6 = (bool)(bVar34 >> 2 & 1);
        bVar7 = (bool)(bVar34 >> 3 & 1);
        bVar8 = (bool)(bVar34 >> 4 & 1);
        bVar9 = (bool)(bVar34 >> 5 & 1);
        bVar10 = (bool)(bVar34 >> 6 & 1);
        *(uint *)local_5cd8 =
             (uint)(bVar34 & 1) * -0x800000 | (uint)!(bool)(bVar34 & 1) * *(int *)local_5cd8;
        *(uint *)(local_5cd8 + 4) =
             (uint)bVar39 * -0x800000 | (uint)!bVar39 * *(int *)(local_5cd8 + 4);
        *(uint *)(local_5cd8 + 8) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5cd8 + 8);
        *(uint *)(local_5cd8 + 0xc) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5cd8 + 0xc);
        *(uint *)(local_5cd8 + 0x10) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5cd8 + 0x10);
        *(uint *)(local_5cd8 + 0x14) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5cd8 + 0x14);
        *(uint *)(local_5cd8 + 0x18) =
             (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_5cd8 + 0x18);
        *(uint *)(local_5cd8 + 0x1c) =
             (uint)(bVar34 >> 7) * -0x800000 |
             (uint)!(bool)(bVar34 >> 7) * *(int *)(local_5cd8 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar31 = local_5cb8 + 1;
    lVar33 = lVar33 + 0x50;
    if (local_5cc0 <= uVar31) break;
LAB_01f58cf0:
    local_5ca8 = uVar31 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_5cb0 = context->scene;
    local_5ca0._0_8_ = lVar33;
    uVar37 = 0;
    bVar35 = bVar27;
    local_5cb8 = uVar31;
    while (*(int *)(lVar33 + uVar37 * 4) != -1) {
      pfVar3 = (local_5cb0->vertices).items[*(uint *)(lVar33 + -0x10 + uVar37 * 4)];
      uVar31 = (ulong)*(uint *)(lVar33 + -0x40 + uVar37 * 4);
      uVar32 = (ulong)*(uint *)(lVar33 + -0x30 + uVar37 * 4);
      fVar1 = pfVar3[uVar31];
      auVar66._4_4_ = fVar1;
      auVar66._0_4_ = fVar1;
      auVar66._8_4_ = fVar1;
      auVar66._12_4_ = fVar1;
      auVar66._16_4_ = fVar1;
      auVar66._20_4_ = fVar1;
      auVar66._24_4_ = fVar1;
      auVar66._28_4_ = fVar1;
      fVar1 = pfVar3[uVar31 + 1];
      auVar45._4_4_ = fVar1;
      auVar45._0_4_ = fVar1;
      auVar45._8_4_ = fVar1;
      auVar45._12_4_ = fVar1;
      auVar45._16_4_ = fVar1;
      auVar45._20_4_ = fVar1;
      auVar45._24_4_ = fVar1;
      auVar45._28_4_ = fVar1;
      fVar1 = pfVar3[uVar31 + 2];
      auVar46._4_4_ = fVar1;
      auVar46._0_4_ = fVar1;
      auVar46._8_4_ = fVar1;
      auVar46._12_4_ = fVar1;
      auVar46._16_4_ = fVar1;
      auVar46._20_4_ = fVar1;
      auVar46._24_4_ = fVar1;
      auVar46._28_4_ = fVar1;
      fVar1 = pfVar3[uVar32];
      auVar47._4_4_ = fVar1;
      auVar47._0_4_ = fVar1;
      auVar47._8_4_ = fVar1;
      auVar47._12_4_ = fVar1;
      auVar47._16_4_ = fVar1;
      auVar47._20_4_ = fVar1;
      auVar47._24_4_ = fVar1;
      auVar47._28_4_ = fVar1;
      fVar1 = pfVar3[uVar32 + 1];
      auVar48._4_4_ = fVar1;
      auVar48._0_4_ = fVar1;
      auVar48._8_4_ = fVar1;
      auVar48._12_4_ = fVar1;
      auVar48._16_4_ = fVar1;
      auVar48._20_4_ = fVar1;
      auVar48._24_4_ = fVar1;
      auVar48._28_4_ = fVar1;
      fVar1 = pfVar3[uVar32 + 2];
      auVar49._4_4_ = fVar1;
      auVar49._0_4_ = fVar1;
      auVar49._8_4_ = fVar1;
      auVar49._12_4_ = fVar1;
      auVar49._16_4_ = fVar1;
      auVar49._20_4_ = fVar1;
      auVar49._24_4_ = fVar1;
      auVar49._28_4_ = fVar1;
      uVar31 = (ulong)*(uint *)(lVar33 + -0x20 + uVar37 * 4);
      fVar1 = pfVar3[uVar31];
      auVar50._4_4_ = fVar1;
      auVar50._0_4_ = fVar1;
      auVar50._8_4_ = fVar1;
      auVar50._12_4_ = fVar1;
      auVar50._16_4_ = fVar1;
      auVar50._20_4_ = fVar1;
      auVar50._24_4_ = fVar1;
      auVar50._28_4_ = fVar1;
      fVar1 = pfVar3[uVar31 + 1];
      auVar51._4_4_ = fVar1;
      auVar51._0_4_ = fVar1;
      auVar51._8_4_ = fVar1;
      auVar51._12_4_ = fVar1;
      auVar51._16_4_ = fVar1;
      auVar51._20_4_ = fVar1;
      auVar51._24_4_ = fVar1;
      auVar51._28_4_ = fVar1;
      fVar1 = pfVar3[uVar31 + 2];
      auVar52._4_4_ = fVar1;
      auVar52._0_4_ = fVar1;
      auVar52._8_4_ = fVar1;
      auVar52._12_4_ = fVar1;
      auVar52._16_4_ = fVar1;
      auVar52._20_4_ = fVar1;
      auVar52._24_4_ = fVar1;
      auVar52._28_4_ = fVar1;
      local_5c10 = *(undefined8 *)(local_5ca8 + 0x30);
      uStack_5c08 = *(undefined8 *)(local_5ca8 + 0x38);
      local_5c20 = *(undefined8 *)(local_5ca8 + 0x40);
      uStack_5c18 = *(undefined8 *)(local_5ca8 + 0x48);
      auVar41 = *(undefined1 (*) [32])ray;
      auVar42 = *(undefined1 (*) [32])(ray + 0x20);
      auVar43 = *(undefined1 (*) [32])(ray + 0x40);
      auVar44 = *(undefined1 (*) [32])(ray + 0x80);
      auVar65 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar76 = ZEXT3264(auVar65);
      auVar67 = *(undefined1 (*) [32])(ray + 0xc0);
      in_ZMM8 = ZEXT3264(auVar67);
      auVar66 = vsubps_avx(auVar66,auVar41);
      auVar45 = vsubps_avx512vl(auVar45,auVar42);
      auVar46 = vsubps_avx512vl(auVar46,auVar43);
      auVar47 = vsubps_avx512vl(auVar47,auVar41);
      auVar48 = vsubps_avx512vl(auVar48,auVar42);
      auVar49 = vsubps_avx512vl(auVar49,auVar43);
      auVar50 = vsubps_avx512vl(auVar50,auVar41);
      auVar51 = vsubps_avx512vl(auVar51,auVar42);
      auVar43 = vsubps_avx512vl(auVar52,auVar43);
      auVar52 = vsubps_avx512vl(auVar50,auVar66);
      in_ZMM10 = ZEXT3264(auVar52);
      auVar53 = vsubps_avx512vl(auVar51,auVar45);
      auVar54 = vsubps_avx512vl(auVar43,auVar46);
      auVar55 = vsubps_avx512vl(auVar66,auVar47);
      auVar56 = vsubps_avx512vl(auVar45,auVar48);
      auVar57 = vsubps_avx512vl(auVar46,auVar49);
      auVar58 = vsubps_avx512vl(auVar47,auVar50);
      auVar59 = vsubps_avx512vl(auVar48,auVar51);
      auVar60 = vsubps_avx512vl(auVar49,auVar43);
      auVar42 = vaddps_avx512vl(auVar50,auVar66);
      auVar61 = vaddps_avx512vl(auVar51,auVar45);
      auVar41 = vaddps_avx512vl(auVar43,auVar46);
      auVar62 = vmulps_avx512vl(auVar61,auVar54);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar53,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar52);
      auVar63 = vfmsub231ps_avx512vl(auVar41,auVar54,auVar42);
      auVar41._4_4_ = auVar42._4_4_ * auVar53._4_4_;
      auVar41._0_4_ = auVar42._0_4_ * auVar53._0_4_;
      auVar41._8_4_ = auVar42._8_4_ * auVar53._8_4_;
      auVar41._12_4_ = auVar42._12_4_ * auVar53._12_4_;
      auVar41._16_4_ = auVar42._16_4_ * auVar53._16_4_;
      auVar41._20_4_ = auVar42._20_4_ * auVar53._20_4_;
      auVar41._24_4_ = auVar42._24_4_ * auVar53._24_4_;
      auVar41._28_4_ = auVar42._28_4_;
      auVar68 = vfmsub231ps_fma(auVar41,auVar52,auVar61);
      fVar1 = auVar67._0_4_;
      auVar61._0_4_ = auVar68._0_4_ * fVar1;
      fVar13 = auVar67._4_4_;
      auVar61._4_4_ = auVar68._4_4_ * fVar13;
      fVar14 = auVar67._8_4_;
      auVar61._8_4_ = auVar68._8_4_ * fVar14;
      fVar15 = auVar67._12_4_;
      auVar61._12_4_ = auVar68._12_4_ * fVar15;
      fVar16 = auVar67._16_4_;
      auVar61._16_4_ = fVar16 * 0.0;
      fVar17 = auVar67._20_4_;
      auVar61._20_4_ = fVar17 * 0.0;
      fVar18 = auVar67._24_4_;
      auVar61._24_4_ = fVar18 * 0.0;
      auVar61._28_4_ = 0;
      auVar41 = vfmadd231ps_avx512vl(auVar61,auVar65,auVar63);
      auVar61 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar62);
      auVar41 = vaddps_avx512vl(auVar66,auVar47);
      auVar42 = vaddps_avx512vl(auVar45,auVar48);
      auVar62 = vaddps_avx512vl(auVar46,auVar49);
      auVar63 = vmulps_avx512vl(auVar42,auVar57);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar56,auVar62);
      auVar62 = vmulps_avx512vl(auVar62,auVar55);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar57,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar56);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar55,auVar42);
      auVar42._4_4_ = auVar41._4_4_ * fVar13;
      auVar42._0_4_ = auVar41._0_4_ * fVar1;
      auVar42._8_4_ = auVar41._8_4_ * fVar14;
      auVar42._12_4_ = auVar41._12_4_ * fVar15;
      auVar42._16_4_ = auVar41._16_4_ * fVar16;
      auVar42._20_4_ = auVar41._20_4_ * fVar17;
      auVar42._24_4_ = auVar41._24_4_ * fVar18;
      auVar42._28_4_ = auVar41._28_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar42,auVar65,auVar62);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar62 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar63);
      auVar41 = vaddps_avx512vl(auVar47,auVar50);
      auVar47 = vaddps_avx512vl(auVar48,auVar51);
      auVar43 = vaddps_avx512vl(auVar49,auVar43);
      auVar48 = vmulps_avx512vl(auVar47,auVar60);
      auVar48 = vfmsub231ps_avx512vl(auVar48,auVar59,auVar43);
      auVar43 = vmulps_avx512vl(auVar43,auVar58);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar60,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar59);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar58,auVar47);
      auVar41 = vmulps_avx512vl(auVar41,auVar67);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar65,auVar43);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar48);
      auVar43 = vaddps_avx512vl(auVar61,auVar62);
      auVar49 = vaddps_avx512vl(auVar41,auVar43);
      auVar50 = auVar79._0_32_;
      vandps_avx512vl(auVar49,auVar50);
      auVar43 = vmulps_avx512vl(auVar49,auVar84._0_32_);
      auVar47 = vminps_avx512vl(auVar61,auVar62);
      auVar47 = vminps_avx512vl(auVar47,auVar41);
      auVar48 = vxorps_avx512vl(auVar43,auVar42);
      uVar19 = vcmpps_avx512vl(auVar47,auVar48,5);
      auVar47 = vmaxps_avx512vl(auVar61,auVar62);
      auVar41 = vmaxps_avx512vl(auVar47,auVar41);
      uVar20 = vcmpps_avx512vl(auVar41,auVar43,2);
      bVar28 = ((byte)uVar19 | (byte)uVar20) & bVar35;
      local_5d00 = CONCAT71(local_5d00._1_7_,bVar35);
      auVar43 = auVar80._0_32_;
      if (bVar28 == 0) {
LAB_01f5912b:
        auVar49 = auVar41;
        bVar28 = 0;
      }
      else {
        auVar41 = vmulps_avx512vl(auVar56,auVar54);
        auVar47 = vmulps_avx512vl(auVar52,auVar57);
        auVar48 = vmulps_avx512vl(auVar55,auVar53);
        auVar51 = vmulps_avx512vl(auVar59,auVar57);
        auVar63 = vmulps_avx512vl(auVar55,auVar60);
        auVar64 = vmulps_avx512vl(auVar58,auVar56);
        auVar53 = vfmsub213ps_avx512vl(auVar53,auVar57,auVar41);
        auVar54 = vfmsub213ps_avx512vl(auVar54,auVar55,auVar47);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar48);
        in_ZMM10 = ZEXT3264(auVar52);
        auVar56 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar51);
        auVar57 = vfmsub213ps_avx512vl(auVar58,auVar57,auVar63);
        auVar55 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar64);
        vandps_avx512vl(auVar41,auVar50);
        vandps_avx512vl(auVar51,auVar50);
        uVar31 = vcmpps_avx512vl(auVar55,auVar55,1);
        vandps_avx512vl(auVar47,auVar50);
        vandps_avx512vl(auVar63,auVar50);
        uVar32 = vcmpps_avx512vl(auVar55,auVar55,1);
        vandps_avx512vl(auVar48,auVar50);
        vandps_avx512vl(auVar64,auVar50);
        uVar21 = vcmpps_avx512vl(auVar55,auVar55,1);
        bVar39 = (bool)((byte)uVar31 & 1);
        auVar58._0_4_ = (uint)bVar39 * auVar53._0_4_ | (uint)!bVar39 * auVar56._0_4_;
        bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar39 * auVar53._4_4_ | (uint)!bVar39 * auVar56._4_4_;
        bVar39 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar39 * auVar53._8_4_ | (uint)!bVar39 * auVar56._8_4_;
        bVar39 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar39 * auVar53._12_4_ | (uint)!bVar39 * auVar56._12_4_;
        bVar39 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar58._16_4_ = (uint)bVar39 * auVar53._16_4_ | (uint)!bVar39 * auVar56._16_4_;
        bVar39 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar58._20_4_ = (uint)bVar39 * auVar53._20_4_ | (uint)!bVar39 * auVar56._20_4_;
        bVar39 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar58._24_4_ = (uint)bVar39 * auVar53._24_4_ | (uint)!bVar39 * auVar56._24_4_;
        bVar39 = SUB81(uVar31 >> 7,0);
        auVar58._28_4_ = (uint)bVar39 * auVar53._28_4_ | (uint)!bVar39 * auVar56._28_4_;
        bVar39 = (bool)((byte)uVar32 & 1);
        auVar56._0_4_ = (uint)bVar39 * auVar54._0_4_ | (uint)!bVar39 * auVar57._0_4_;
        bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar39 * auVar54._4_4_ | (uint)!bVar39 * auVar57._4_4_;
        bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar39 * auVar54._8_4_ | (uint)!bVar39 * auVar57._8_4_;
        bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar39 * auVar54._12_4_ | (uint)!bVar39 * auVar57._12_4_;
        bVar39 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar39 * auVar54._16_4_ | (uint)!bVar39 * auVar57._16_4_;
        bVar39 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar39 * auVar54._20_4_ | (uint)!bVar39 * auVar57._20_4_;
        bVar39 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar39 * auVar54._24_4_ | (uint)!bVar39 * auVar57._24_4_;
        bVar39 = SUB81(uVar32 >> 7,0);
        auVar56._28_4_ = (uint)bVar39 * auVar54._28_4_ | (uint)!bVar39 * auVar57._28_4_;
        bVar39 = (bool)((byte)uVar21 & 1);
        auVar54._0_4_ = (float)((uint)bVar39 * auVar52._0_4_ | (uint)!bVar39 * auVar55._0_4_);
        bVar39 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar54._4_4_ = (float)((uint)bVar39 * auVar52._4_4_ | (uint)!bVar39 * auVar55._4_4_);
        bVar39 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar54._8_4_ = (float)((uint)bVar39 * auVar52._8_4_ | (uint)!bVar39 * auVar55._8_4_);
        bVar39 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar54._12_4_ = (float)((uint)bVar39 * auVar52._12_4_ | (uint)!bVar39 * auVar55._12_4_);
        bVar39 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar54._16_4_ = (float)((uint)bVar39 * auVar52._16_4_ | (uint)!bVar39 * auVar55._16_4_);
        bVar39 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar54._20_4_ = (float)((uint)bVar39 * auVar52._20_4_ | (uint)!bVar39 * auVar55._20_4_);
        bVar39 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar54._24_4_ = (float)((uint)bVar39 * auVar52._24_4_ | (uint)!bVar39 * auVar55._24_4_);
        bVar39 = SUB81(uVar21 >> 7,0);
        auVar54._28_4_ = (uint)bVar39 * auVar52._28_4_ | (uint)!bVar39 * auVar55._28_4_;
        auVar53._4_4_ = fVar13 * auVar54._4_4_;
        auVar53._0_4_ = fVar1 * auVar54._0_4_;
        auVar53._8_4_ = fVar14 * auVar54._8_4_;
        auVar53._12_4_ = fVar15 * auVar54._12_4_;
        auVar53._16_4_ = fVar16 * auVar54._16_4_;
        auVar53._20_4_ = fVar17 * auVar54._20_4_;
        auVar53._24_4_ = fVar18 * auVar54._24_4_;
        auVar53._28_4_ = auVar67._28_4_;
        in_ZMM8 = ZEXT3264(auVar53);
        auVar68 = vfmadd213ps_fma(auVar65,auVar56,auVar53);
        auVar68 = vfmadd213ps_fma(auVar44,auVar58,ZEXT1632(auVar68));
        auVar67 = ZEXT1632(CONCAT412(auVar68._12_4_ + auVar68._12_4_,
                                     CONCAT48(auVar68._8_4_ + auVar68._8_4_,
                                              CONCAT44(auVar68._4_4_ + auVar68._4_4_,
                                                       auVar68._0_4_ + auVar68._0_4_))));
        auVar44._0_4_ = auVar46._0_4_ * auVar54._0_4_;
        auVar44._4_4_ = auVar46._4_4_ * auVar54._4_4_;
        auVar44._8_4_ = auVar46._8_4_ * auVar54._8_4_;
        auVar44._12_4_ = auVar46._12_4_ * auVar54._12_4_;
        auVar44._16_4_ = auVar46._16_4_ * auVar54._16_4_;
        auVar44._20_4_ = auVar46._20_4_ * auVar54._20_4_;
        auVar44._24_4_ = auVar46._24_4_ * auVar54._24_4_;
        auVar44._28_4_ = 0;
        auVar68 = vfmadd213ps_fma(auVar45,auVar56,auVar44);
        auVar23 = vfmadd213ps_fma(auVar66,auVar58,ZEXT1632(auVar68));
        auVar44 = vrcp14ps_avx512vl(auVar67);
        auVar65 = vxorps_avx512vl(auVar67,auVar42);
        auVar76 = ZEXT3264(auVar65);
        auVar41 = vfnmadd213ps_avx512vl(auVar44,auVar67,auVar43);
        auVar68 = vfmadd132ps_fma(auVar41,auVar44,auVar44);
        auVar42 = ZEXT1632(CONCAT412((auVar23._12_4_ + auVar23._12_4_) * auVar68._12_4_,
                                     CONCAT48((auVar23._8_4_ + auVar23._8_4_) * auVar68._8_4_,
                                              CONCAT44((auVar23._4_4_ + auVar23._4_4_) *
                                                       auVar68._4_4_,
                                                       (auVar23._0_4_ + auVar23._0_4_) *
                                                       auVar68._0_4_))));
        uVar19 = vcmpps_avx512vl(auVar42,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar20 = vcmpps_avx512vl(auVar42,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar22 = vcmpps_avx512vl(auVar67,auVar65,4);
        bVar28 = bVar28 & (byte)uVar19 & (byte)uVar20 & (byte)uVar22;
        if (bVar28 == 0) goto LAB_01f5912b;
        _local_5960 = auVar61;
        _local_5980 = auVar62;
        local_59a0 = auVar49;
        local_59c0 = auVar42;
        local_59e0 = auVar58;
        local_5a00 = auVar56;
        local_5a20 = auVar54;
      }
      pGVar4 = (context->scene->geometries).items[*(uint *)((long)&local_5c10 + uVar37 * 4)].ptr;
      uVar2 = pGVar4->mask;
      auVar67._4_4_ = uVar2;
      auVar67._0_4_ = uVar2;
      auVar67._8_4_ = uVar2;
      auVar67._12_4_ = uVar2;
      auVar67._16_4_ = uVar2;
      auVar67._20_4_ = uVar2;
      auVar67._24_4_ = uVar2;
      auVar67._28_4_ = uVar2;
      uVar19 = vptestmd_avx512vl(auVar67,*(undefined1 (*) [32])(ray + 0x120));
      bVar28 = (byte)uVar19 & bVar28;
      if (bVar28 == 0) {
      }
      else {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          vandps_avx512vl(local_59a0,auVar50);
          auVar55._8_4_ = 0x219392ef;
          auVar55._0_8_ = 0x219392ef219392ef;
          auVar55._12_4_ = 0x219392ef;
          auVar55._16_4_ = 0x219392ef;
          auVar55._20_4_ = 0x219392ef;
          auVar55._24_4_ = 0x219392ef;
          auVar55._28_4_ = 0x219392ef;
          uVar31 = vcmpps_avx512vl(auVar49,auVar55,5);
          auVar41 = vrcp14ps_avx512vl(local_59a0);
          auVar42 = vfnmadd213ps_avx512vl(auVar41,local_59a0,auVar43);
          auVar42 = vfmadd132ps_avx512vl(auVar42,auVar41,auVar41);
          fVar1 = (float)((uint)((byte)uVar31 & 1) * auVar42._0_4_);
          fVar18 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar42._4_4_);
          fVar17 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar42._8_4_);
          fVar16 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar42._12_4_);
          fVar15 = (float)((uint)((byte)(uVar31 >> 4) & 1) * auVar42._16_4_);
          fVar14 = (float)((uint)((byte)(uVar31 >> 5) & 1) * auVar42._20_4_);
          fVar13 = (float)((uint)((byte)(uVar31 >> 6) & 1) * auVar42._24_4_);
          auVar57._4_4_ = fVar18 * (float)local_5960._4_4_;
          auVar57._0_4_ = fVar1 * (float)local_5960._0_4_;
          auVar57._8_4_ = fVar17 * fStack_5958;
          auVar57._12_4_ = fVar16 * fStack_5954;
          auVar57._16_4_ = fVar15 * fStack_5950;
          auVar57._20_4_ = fVar14 * fStack_594c;
          auVar57._24_4_ = fVar13 * fStack_5948;
          auVar57._28_4_ = auVar41._28_4_;
          local_58e0 = vminps_avx512vl(auVar57,auVar43);
          auVar59._4_4_ = fVar18 * (float)local_5980._4_4_;
          auVar59._0_4_ = fVar1 * (float)local_5980._0_4_;
          auVar59._8_4_ = fVar17 * fStack_5978;
          auVar59._12_4_ = fVar16 * fStack_5974;
          auVar59._16_4_ = fVar15 * fStack_5970;
          auVar59._20_4_ = fVar14 * fStack_596c;
          auVar59._24_4_ = fVar13 * fStack_5968;
          auVar59._28_4_ = (uint)(byte)(uVar31 >> 7) * auVar42._28_4_;
          local_58c0 = vminps_avx512vl(auVar59,auVar43);
          local_5880 = vpbroadcastd_avx512vl();
          local_58a0 = vpbroadcastd_avx512vl();
          local_5940 = local_59e0._0_8_;
          uStack_5938 = local_59e0._8_8_;
          uStack_5930 = local_59e0._16_8_;
          uStack_5928 = local_59e0._24_8_;
          local_5920 = local_5a00._0_8_;
          uStack_5918 = local_5a00._8_8_;
          uStack_5910 = local_5a00._16_8_;
          uStack_5908 = local_5a00._24_8_;
          local_5900 = local_5a20._0_8_;
          uStack_58f8 = local_5a20._8_8_;
          uStack_58f0 = local_5a20._16_8_;
          uStack_58e8 = local_5a20._24_8_;
          vpcmpeqd_avx2(local_58e0,local_58e0);
          uStack_585c = context->user->instID[0];
          local_5860 = uStack_585c;
          uStack_5858 = uStack_585c;
          uStack_5854 = uStack_585c;
          uStack_5850 = uStack_585c;
          uStack_584c = uStack_585c;
          uStack_5848 = uStack_585c;
          uStack_5844 = uStack_585c;
          uStack_583c = context->user->instPrimID[0];
          local_5840 = uStack_583c;
          uStack_5838 = uStack_583c;
          uStack_5834 = uStack_583c;
          uStack_5830 = uStack_583c;
          uStack_582c = uStack_583c;
          uStack_5828 = uStack_583c;
          uStack_5824 = uStack_583c;
          local_5c00 = *(undefined1 (*) [32])(ray + 0x100);
          auVar41 = vblendmps_avx512vl(local_5c00,local_59c0);
          bVar39 = (bool)(bVar28 >> 1 & 1);
          bVar6 = (bool)(bVar28 >> 2 & 1);
          bVar7 = (bool)(bVar28 >> 3 & 1);
          bVar8 = (bool)(bVar28 >> 4 & 1);
          bVar9 = (bool)(bVar28 >> 5 & 1);
          bVar10 = (bool)(bVar28 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar28 & 1) * auVar41._0_4_ | !(bool)(bVar28 & 1) * uStack_583c;
          *(uint *)(ray + 0x104) = (uint)bVar39 * auVar41._4_4_ | !bVar39 * uStack_583c;
          *(uint *)(ray + 0x108) = (uint)bVar6 * auVar41._8_4_ | !bVar6 * uStack_583c;
          *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar41._12_4_ | !bVar7 * uStack_583c;
          *(uint *)(ray + 0x110) = (uint)bVar8 * auVar41._16_4_ | !bVar8 * uStack_583c;
          *(uint *)(ray + 0x114) = (uint)bVar9 * auVar41._20_4_ | !bVar9 * uStack_583c;
          *(uint *)(ray + 0x118) = (uint)bVar10 * auVar41._24_4_ | !bVar10 * uStack_583c;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar28 >> 7) * auVar41._28_4_ | !(bool)(bVar28 >> 7) * uStack_583c;
          local_5c40 = vpmovm2d_avx512vl((ulong)bVar28);
          local_5c70.valid = (int *)local_5c40;
          local_5c70.geometryUserPtr = pGVar4->userPtr;
          local_5c70.context = context->user;
          local_5c70.hit = (RTCHitN *)&local_5940;
          local_5c70.N = 8;
          local_5c70.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar76 = ZEXT1664(auVar76._0_16_);
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            (*pGVar4->occlusionFilterN)(&local_5c70);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar84 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar83 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar82 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar81 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar80 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar79 = ZEXT3264(auVar41);
            ray = local_5cf0;
            uVar40 = local_5cf8;
            context = local_5ce8;
          }
          if (local_5c40 == (undefined1  [32])0x0) {
            uVar31 = 0;
          }
          else {
            p_Var5 = context->args->filter;
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              auVar76 = ZEXT1664(auVar76._0_16_);
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
              (*p_Var5)(&local_5c70);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar84 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar83 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar82 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar81 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar80 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar79 = ZEXT3264(auVar41);
              ray = local_5cf0;
              uVar40 = local_5cf8;
              context = local_5ce8;
            }
            uVar31 = vptestmd_avx512vl(local_5c40,local_5c40);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar39 = (bool)((byte)uVar31 & 1);
            auVar43._0_4_ =
                 (uint)bVar39 * auVar41._0_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x100);
            bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar43._4_4_ =
                 (uint)bVar39 * auVar41._4_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x104);
            bVar39 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar43._8_4_ =
                 (uint)bVar39 * auVar41._8_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x108);
            bVar39 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar43._12_4_ =
                 (uint)bVar39 * auVar41._12_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x10c);
            bVar39 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar43._16_4_ =
                 (uint)bVar39 * auVar41._16_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x110);
            bVar39 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar43._20_4_ =
                 (uint)bVar39 * auVar41._20_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x114);
            bVar39 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar43._24_4_ =
                 (uint)bVar39 * auVar41._24_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x118);
            bVar39 = SUB81(uVar31 >> 7,0);
            auVar43._28_4_ =
                 (uint)bVar39 * auVar41._28_4_ | (uint)!bVar39 * *(int *)(local_5c70.ray + 0x11c);
            *(undefined1 (*) [32])(local_5c70.ray + 0x100) = auVar43;
          }
          bVar28 = (byte)uVar31;
          auVar60._0_4_ =
               (uint)(bVar28 & 1) * *(int *)local_5cd8 |
               (uint)!(bool)(bVar28 & 1) * local_5c00._0_4_;
          bVar39 = (bool)((byte)(uVar31 >> 1) & 1);
          auVar60._4_4_ = (uint)bVar39 * *(int *)(local_5cd8 + 4) | (uint)!bVar39 * local_5c00._4_4_
          ;
          bVar39 = (bool)((byte)(uVar31 >> 2) & 1);
          auVar60._8_4_ = (uint)bVar39 * *(int *)(local_5cd8 + 8) | (uint)!bVar39 * local_5c00._8_4_
          ;
          bVar39 = (bool)((byte)(uVar31 >> 3) & 1);
          auVar60._12_4_ =
               (uint)bVar39 * *(int *)(local_5cd8 + 0xc) | (uint)!bVar39 * local_5c00._12_4_;
          bVar39 = (bool)((byte)(uVar31 >> 4) & 1);
          auVar60._16_4_ =
               (uint)bVar39 * *(int *)(local_5cd8 + 0x10) | (uint)!bVar39 * local_5c00._16_4_;
          bVar39 = (bool)((byte)(uVar31 >> 5) & 1);
          auVar60._20_4_ =
               (uint)bVar39 * *(int *)(local_5cd8 + 0x14) | (uint)!bVar39 * local_5c00._20_4_;
          bVar39 = (bool)((byte)(uVar31 >> 6) & 1);
          auVar60._24_4_ =
               (uint)bVar39 * *(int *)(local_5cd8 + 0x18) | (uint)!bVar39 * local_5c00._24_4_;
          bVar39 = (bool)((byte)(uVar31 >> 7) & 1);
          auVar60._28_4_ =
               (uint)bVar39 * *(int *)(local_5cd8 + 0x1c) | (uint)!bVar39 * local_5c00._28_4_;
          *(undefined1 (*) [32])local_5cd8 = auVar60;
        }
        bVar35 = (byte)local_5d00 & ~bVar28;
      }
      lVar33 = local_5ca0._0_8_;
      if ((bVar35 == 0) || (bVar39 = 2 < uVar37, uVar37 = uVar37 + 1, bVar39)) break;
    }
    bVar27 = bVar27 & bVar35;
    if (bVar27 == 0) break;
  }
  bVar27 = ~bVar27;
LAB_01f59441:
  bVar34 = bVar34 | bVar27;
  if (bVar34 == 0xff) {
    bVar34 = 0xff;
    goto LAB_01f59578;
  }
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5a40._0_4_ =
       (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * local_5a40._0_4_;
  bVar39 = (bool)(bVar34 >> 1 & 1);
  local_5a40._4_4_ = (uint)bVar39 * auVar41._4_4_ | (uint)!bVar39 * local_5a40._4_4_;
  bVar39 = (bool)(bVar34 >> 2 & 1);
  local_5a40._8_4_ = (uint)bVar39 * auVar41._8_4_ | (uint)!bVar39 * local_5a40._8_4_;
  bVar39 = (bool)(bVar34 >> 3 & 1);
  local_5a40._12_4_ = (uint)bVar39 * auVar41._12_4_ | (uint)!bVar39 * local_5a40._12_4_;
  bVar39 = (bool)(bVar34 >> 4 & 1);
  local_5a40._16_4_ = (uint)bVar39 * auVar41._16_4_ | (uint)!bVar39 * local_5a40._16_4_;
  bVar39 = (bool)(bVar34 >> 5 & 1);
  local_5a40._20_4_ = (uint)bVar39 * auVar41._20_4_ | (uint)!bVar39 * local_5a40._20_4_;
  bVar39 = (bool)(bVar34 >> 6 & 1);
  local_5a40._24_4_ = (uint)bVar39 * auVar41._24_4_ | (uint)!bVar39 * local_5a40._24_4_;
  local_5a40._28_4_ =
       (uint)(bVar34 >> 7) * auVar41._28_4_ | (uint)!(bool)(bVar34 >> 7) * local_5a40._28_4_;
  goto LAB_01f58ac3;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }